

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O2

void __thiscall
ASDCP::MXF::TimedTextResourceSubDescriptor::TimedTextResourceSubDescriptor
          (TimedTextResourceSubDescriptor *this,Dictionary *d)

{
  Dictionary *this_00;
  undefined8 uVar1;
  undefined8 uVar2;
  UUID *pUVar3;
  MDDEntry *pMVar4;
  
  InterchangeObject::InterchangeObject(&this->super_InterchangeObject,d);
  (this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket =
       (_func_int **)&PTR__TimedTextResourceSubDescriptor_002182a8;
  (this->AncillaryResourceID).super_Identifier<16U>.m_HasValue = false;
  (this->AncillaryResourceID).super_Identifier<16U>.m_Value[0] = '\0';
  (this->AncillaryResourceID).super_Identifier<16U>.m_Value[1] = '\0';
  (this->AncillaryResourceID).super_Identifier<16U>.m_Value[2] = '\0';
  (this->AncillaryResourceID).super_Identifier<16U>.m_Value[3] = '\0';
  (this->AncillaryResourceID).super_Identifier<16U>.m_Value[4] = '\0';
  (this->AncillaryResourceID).super_Identifier<16U>.m_Value[5] = '\0';
  (this->AncillaryResourceID).super_Identifier<16U>.m_Value[6] = '\0';
  pUVar3 = &this->AncillaryResourceID;
  (pUVar3->super_Identifier<16U>).m_Value[7] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[8] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[9] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[10] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[0xb] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[0xc] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[0xd] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[0xe] = '\0';
  (this->AncillaryResourceID).super_Identifier<16U>.m_Value[0xf] = '\0';
  (this->AncillaryResourceID).super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_00216010;
  (this->MIMEMediaType).super_string._M_dataplus._M_p =
       (pointer)&(this->MIMEMediaType).super_string.field_2;
  (this->MIMEMediaType).super_string._M_string_length = 0;
  (this->MIMEMediaType).super_string.field_2._M_local_buf[0] = '\0';
  (this->MIMEMediaType).super_IArchive._vptr_IArchive = (_func_int **)&PTR__UTF16String_00215c60;
  this->EssenceStreamID = 0;
  this_00 = (this->super_InterchangeObject).m_Dict;
  if (this_00 != (Dictionary *)0x0) {
    pMVar4 = Dictionary::Type(this_00,MDD_TimedTextResourceSubDescriptor);
    uVar1 = *(undefined8 *)pMVar4->ul;
    uVar2 = *(undefined8 *)(pMVar4->ul + 8);
    (this->super_InterchangeObject).super_KLVPacket.m_UL.super_Identifier<16U>.m_HasValue = true;
    *(undefined8 *)
     (this->super_InterchangeObject).super_KLVPacket.m_UL.super_Identifier<16U>.m_Value = uVar1;
    *(undefined8 *)
     ((this->super_InterchangeObject).super_KLVPacket.m_UL.super_Identifier<16U>.m_Value + 8) =
         uVar2;
    return;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,0xd4f,
                "ASDCP::MXF::TimedTextResourceSubDescriptor::TimedTextResourceSubDescriptor(const Dictionary *)"
               );
}

Assistant:

TimedTextResourceSubDescriptor::TimedTextResourceSubDescriptor(const Dictionary* d) : InterchangeObject(d), EssenceStreamID(0)
{
  assert(m_Dict);
  m_UL = m_Dict->ul(MDD_TimedTextResourceSubDescriptor);
}